

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QPixmapStyleDescriptor * __thiscall
QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
          (QPixmapStyleDescriptor *__return_storage_ptr__,
          QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *this,
          ControlDescriptor *key)

{
  Data *pDVar1;
  QSize QVar2;
  QTileRules QVar3;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *pNVar7;
  
  if ((this->d !=
       (Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_> *)0x0) &&
     (pNVar7 = QHashPrivate::
               Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>::
               findNode<QPixmapStyle::ControlDescriptor>(this->d,key),
     pNVar7 != (Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)0x0)) {
    pDVar1 = (pNVar7->value).fileName.d.d;
    (__return_storage_ptr__->fileName).d.d = pDVar1;
    (__return_storage_ptr__->fileName).d.ptr = (pNVar7->value).fileName.d.ptr;
    (__return_storage_ptr__->fileName).d.size = (pNVar7->value).fileName.d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    QVar2 = (pNVar7->value).size;
    RVar5.m_i = (pNVar7->value).margins.m_left.m_i;
    RVar6.m_i = (pNVar7->value).margins.m_top.m_i;
    RVar4.m_i = (pNVar7->value).margins.m_bottom.m_i;
    QVar3 = (pNVar7->value).tileRules;
    (__return_storage_ptr__->margins).m_right = (Representation)(pNVar7->value).margins.m_right.m_i;
    (__return_storage_ptr__->margins).m_bottom = (Representation)RVar4.m_i;
    __return_storage_ptr__->tileRules = QVar3;
    __return_storage_ptr__->size = QVar2;
    (__return_storage_ptr__->margins).m_left = (Representation)RVar5.m_i;
    (__return_storage_ptr__->margins).m_top = (Representation)RVar6.m_i;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->fileName).d.d = (Data *)0x0;
  (__return_storage_ptr__->fileName).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->fileName).d.size = 0;
  (__return_storage_ptr__->size).wd = -1;
  (__return_storage_ptr__->size).ht = -1;
  (__return_storage_ptr__->margins).m_left = 0;
  (__return_storage_ptr__->margins).m_top = 0;
  (__return_storage_ptr__->margins).m_right = 0;
  (__return_storage_ptr__->margins).m_bottom = 0;
  (__return_storage_ptr__->tileRules).horizontal = StretchTile;
  (__return_storage_ptr__->tileRules).vertical = StretchTile;
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }